

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COpenGLCoreTexture.h
# Opt level: O0

void * __thiscall
irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>::lock
          (COpenGLCoreTexture<irr::video::COpenGLDriver> *this,E_TEXTURE_LOCK_MODE mode,
          u32 mipmapLevel,u32 layer,E_TEXTURE_LOCK_FLAGS lockFlags)

{
  GLenum GVar1;
  GLenum GVar2;
  PFNGLGETTEXIMAGEPROC_MT p_Var3;
  bool bVar4;
  u32 uVar5;
  void *pvVar6;
  IImage **ppIVar7;
  COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
  *pCVar8;
  COpenGLCacheHandler *this_00;
  dimension2d<unsigned_int> *pdVar9;
  E_DRIVER_TYPE in_ECX;
  int in_EDX;
  u32 in_ESI;
  STextureCache *in_RDI;
  int in_R8D;
  u32 i;
  u8 *tmpBuffer;
  u8 *srcB;
  u8 *srcA;
  s32 pitch;
  GLenum tmpTextureType;
  IImage *tmpImage;
  bool passed;
  dimension2d<unsigned_int> lockImageSize;
  u32 in_stack_ffffffffffffff5c;
  array<irr::video::IImage_*> *in_stack_ffffffffffffff60;
  u32 uVar10;
  COpenGLCoreTexture<irr::video::COpenGLDriver> *in_stack_ffffffffffffff68;
  u32 in_stack_ffffffffffffff74;
  uint uVar11;
  IImage *in_stack_ffffffffffffff78;
  uint local_5c;
  void *local_50;
  void *local_48;
  GLenum local_3c;
  undefined1 local_28 [4];
  STextureCache *this_01;
  void *local_8;
  
  if (in_RDI[3].CacheHandler !=
      (COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
       *)0x0) {
    pvVar6 = getLockImageData(in_stack_ffffffffffffff68,
                              (u32)((ulong)in_stack_ffffffffffffff60 >> 0x20));
    return pvVar6;
  }
  this_01 = in_RDI;
  bVar4 = IImage::isCompressedFormat(*(ECOLOR_FORMAT *)(in_RDI[1].Texture + 3));
  if (bVar4) {
    return (void *)0x0;
  }
  *(bool *)&in_RDI[2].TextureCount = (in_RDI[2].TextureCount & 1) != 0 || in_ESI == 1;
  in_RDI[3].DriverType = in_ECX;
  *(char *)&in_RDI[3].TextureCount = (char)in_EDX;
  if ((in_RDI[3].field_0xc & 1) == 0) goto LAB_0034f829;
  if (in_EDX != 0) {
    ppIVar7 = core::array<irr::video::IImage_*>::operator[]
                        (in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
    if (*ppIVar7 == (IImage *)0x0) goto LAB_0034f829;
    core::array<irr::video::IImage_*>::operator[]
              (in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
    pvVar6 = IImage::getMipMapsData(in_stack_ffffffffffffff78,in_stack_ffffffffffffff74);
    if (pvVar6 == (void *)0x0) goto LAB_0034f829;
  }
  ppIVar7 = core::array<irr::video::IImage_*>::operator[]
                      (in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
  in_RDI[3].CacheHandler =
       (COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
        *)*ppIVar7;
  IReferenceCounted::grab
            ((IReferenceCounted *)
             ((in_RDI[3].CacheHandler)->_vptr_COpenGLCoreCacheHandler[-3] + -0x10 +
             (long)(((in_RDI[3].CacheHandler)->TextureCache).Texture + -2)));
LAB_0034f829:
  uVar10 = (u32)((ulong)in_stack_ffffffffffffff60 >> 0x20);
  if (in_RDI[3].CacheHandler ==
      (COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
       *)0x0) {
    _local_28 = IImage::getMipMapsSize((dimension2du *)in_stack_ffffffffffffff68,uVar10);
    pCVar8 = (COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
              *)(**(code **)(**(long **)&in_RDI[2].DriverType + 0x250))
                          (*(long **)&in_RDI[2].DriverType,*(undefined4 *)(in_RDI[1].Texture + 3),
                           local_28);
    uVar10 = (u32)((ulong)in_stack_ffffffffffffff60 >> 0x20);
    in_RDI[3].CacheHandler = pCVar8;
    if ((in_RDI[3].CacheHandler !=
         (COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
          *)0x0) && (in_ESI != 2)) {
      pCVar8 = in_RDI[3].CacheHandler;
      this_00 = COpenGLDriver::getCacheHandler(*(COpenGLDriver **)&in_RDI[2].DriverType);
      COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
      ::getTextureCache(&this_00->
                         super_COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
                       );
      COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
      ::STextureCache::set(this_01,in_ESI,(ITexture *)CONCAT44(in_ECX,in_R8D),local_28._4_4_);
      COpenGLDriver::testGLError(*(COpenGLDriver **)&in_RDI[2].DriverType,0xf4);
      p_Var3 = GL.GetTexImage;
      local_3c = *(GLenum *)in_RDI[2].Texture;
      if (local_3c == 0x8513) {
        local_3c = in_ECX + 0x8515;
      }
      uVar10 = in_RDI[3].TextureCount;
      GVar1 = *(GLenum *)((long)in_RDI[2].Texture + 0xc);
      GVar2 = *(GLenum *)(in_RDI[2].Texture + 2);
      pvVar6 = IImage::getData((IImage *)pCVar8);
      (*p_Var3)(local_3c,(GLint)(char)uVar10,GVar1,GVar2,pvVar6);
      COpenGLDriver::testGLError(*(COpenGLDriver **)&in_RDI[2].DriverType,0xff);
      uVar10 = (u32)((ulong)in_stack_ffffffffffffff60 >> 0x20);
      if (((in_RDI[1].TextureCount & 0x100) != 0) && (in_R8D == 1)) {
        uVar5 = IImage::getPitch((IImage *)pCVar8);
        local_48 = IImage::getData((IImage *)pCVar8);
        local_50 = local_48;
        pdVar9 = IImage::getDimension((IImage *)pCVar8);
        local_50 = (void *)((long)local_50 + (ulong)((pdVar9->Height - 1) * uVar5));
        in_stack_ffffffffffffff68 =
             (COpenGLCoreTexture<irr::video::COpenGLDriver> *)operator_new__((long)(int)uVar5);
        local_5c = 0;
        while( true ) {
          uVar11 = local_5c;
          pdVar9 = IImage::getDimension((IImage *)pCVar8);
          uVar10 = (u32)((ulong)in_stack_ffffffffffffff60 >> 0x20);
          if (pdVar9->Height <= uVar11) break;
          memcpy(in_stack_ffffffffffffff68,local_48,(long)(int)uVar5);
          memcpy(local_48,local_50,(long)(int)uVar5);
          memcpy(local_50,in_stack_ffffffffffffff68,(long)(int)uVar5);
          local_48 = (void *)((long)local_48 + (long)(int)uVar5);
          local_50 = (void *)((long)local_50 - (long)(int)uVar5);
          local_5c = local_5c + 2;
        }
        if (in_stack_ffffffffffffff68 != (COpenGLCoreTexture<irr::video::COpenGLDriver> *)0x0) {
          operator_delete__(in_stack_ffffffffffffff68);
        }
      }
    }
    COpenGLDriver::testGLError(*(COpenGLDriver **)&in_RDI[2].DriverType,0x151);
  }
  if (in_RDI[3].CacheHandler ==
      (COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
       *)0x0) {
    local_8 = (void *)0x0;
  }
  else {
    local_8 = getLockImageData(in_stack_ffffffffffffff68,uVar10);
  }
  return local_8;
}

Assistant:

void *lock(E_TEXTURE_LOCK_MODE mode = ETLM_READ_WRITE, u32 mipmapLevel = 0, u32 layer = 0, E_TEXTURE_LOCK_FLAGS lockFlags = ETLF_FLIP_Y_UP_RTT) override
	{
		if (LockImage)
			return getLockImageData(MipLevelStored);

		if (IImage::isCompressedFormat(ColorFormat))
			return 0;

		LockReadOnly |= (mode == ETLM_READ_ONLY);
		LockLayer = layer;
		MipLevelStored = mipmapLevel;

		if (KeepImage) {
			_IRR_DEBUG_BREAK_IF(LockLayer > Images.size())

			if (mipmapLevel == 0 || (Images[LockLayer] && Images[LockLayer]->getMipMapsData(mipmapLevel))) {
				LockImage = Images[LockLayer];
				LockImage->grab();
			}
		}

		if (!LockImage) {
			core::dimension2d<u32> lockImageSize(IImage::getMipMapsSize(Size, MipLevelStored));

			// note: we save mipmap data also in the image because IImage doesn't allow saving single mipmap levels to the mipmap data
			LockImage = Driver->createImage(ColorFormat, lockImageSize);

			if (LockImage && mode != ETLM_WRITE_ONLY) {
				bool passed = true;

#ifdef IRR_COMPILE_GL_COMMON
				IImage *tmpImage = LockImage; // not sure yet if the size required by glGetTexImage is always correct, if not we might have to allocate a different tmpImage and convert colors later on.

				Driver->getCacheHandler()->getTextureCache().set(0, this);
				Driver->testGLError(__LINE__);

				GLenum tmpTextureType = TextureType;

				if (tmpTextureType == GL_TEXTURE_CUBE_MAP) {
					_IRR_DEBUG_BREAK_IF(layer > 5)

					tmpTextureType = GL_TEXTURE_CUBE_MAP_POSITIVE_X + layer;
				}

				GL.GetTexImage(tmpTextureType, MipLevelStored, PixelFormat, PixelType, tmpImage->getData());
				Driver->testGLError(__LINE__);

				if (IsRenderTarget && lockFlags == ETLF_FLIP_Y_UP_RTT) {
					const s32 pitch = tmpImage->getPitch();

					u8 *srcA = static_cast<u8 *>(tmpImage->getData());
					u8 *srcB = srcA + (tmpImage->getDimension().Height - 1) * pitch;

					u8 *tmpBuffer = new u8[pitch];

					for (u32 i = 0; i < tmpImage->getDimension().Height; i += 2) {
						memcpy(tmpBuffer, srcA, pitch);
						memcpy(srcA, srcB, pitch);
						memcpy(srcB, tmpBuffer, pitch);
						srcA += pitch;
						srcB -= pitch;
					}

					delete[] tmpBuffer;
				}
#elif (defined(IRR_COMPILE_GLES2_COMMON) || defined(IRR_COMPILE_GLES_COMMON))
				// TODO: on ES2 we can likely also work with glCopyTexImage2D instead of rendering which should be faster.
				COpenGLCoreTexture *tmpTexture = new COpenGLCoreTexture("OGL_CORE_LOCK_TEXTURE", Size, ETT_2D, ColorFormat, Driver);

				GLuint tmpFBO = 0;
				Driver->irrGlGenFramebuffers(1, &tmpFBO);

				GLint prevViewportX = 0;
				GLint prevViewportY = 0;
				GLsizei prevViewportWidth = 0;
				GLsizei prevViewportHeight = 0;
				Driver->getCacheHandler()->getViewport(prevViewportX, prevViewportY, prevViewportWidth, prevViewportHeight);
				Driver->getCacheHandler()->setViewport(0, 0, Size.Width, Size.Height);

				GLuint prevFBO = 0;
				Driver->getCacheHandler()->getFBO(prevFBO);
				Driver->getCacheHandler()->setFBO(tmpFBO);

				Driver->irrGlFramebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, tmpTexture->getOpenGLTextureName(), 0);

				GL.Clear(GL_COLOR_BUFFER_BIT);

				Driver->draw2DImage(this, layer, true);

				IImage *tmpImage = Driver->createImage(ECF_A8R8G8B8, Size);
				GL.ReadPixels(0, 0, Size.Width, Size.Height, GL_RGBA, GL_UNSIGNED_BYTE, tmpImage->getData());

				Driver->getCacheHandler()->setFBO(prevFBO);
				Driver->getCacheHandler()->setViewport(prevViewportX, prevViewportY, prevViewportWidth, prevViewportHeight);

				Driver->irrGlDeleteFramebuffers(1, &tmpFBO);
				delete tmpTexture;

				void *src = tmpImage->getData();
				void *dest = LockImage->getData();

				switch (ColorFormat) {
				case ECF_A1R5G5B5:
					CColorConverter::convert_A8R8G8B8toA1B5G5R5(src, tmpImage->getDimension().getArea(), dest);
					break;
				case ECF_R5G6B5:
					CColorConverter::convert_A8R8G8B8toR5G6B5(src, tmpImage->getDimension().getArea(), dest);
					break;
				case ECF_R8G8B8:
					CColorConverter::convert_A8R8G8B8toB8G8R8(src, tmpImage->getDimension().getArea(), dest);
					break;
				case ECF_A8R8G8B8:
					CColorConverter::convert_A8R8G8B8toA8B8G8R8(src, tmpImage->getDimension().getArea(), dest);
					break;
				default:
					passed = false;
					break;
				}
				tmpImage->drop();
#endif

				if (!passed) {
					LockImage->drop();
					LockImage = 0;
				}
			}

			Driver->testGLError(__LINE__);
		}

		return (LockImage) ? getLockImageData(MipLevelStored) : 0;
	}